

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<solitaire::graphics::TextureId> *
testing::internal::ActionResultHolder<solitaire::graphics::TextureId>::
PerformAction<solitaire::graphics::TextureId(std::__cxx11::string_const&)>
          (Action<solitaire::graphics::TextureId_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           *action,ArgumentTuple *args)

{
  ArgumentTuple *args_00;
  ActionResultHolder<solitaire::graphics::TextureId> *this;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_28;
  undefined1 local_20 [16];
  ArgumentTuple *args_local;
  Action<solitaire::graphics::TextureId_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *action_local;
  
  local_20._8_8_ = args;
  args_local = (ArgumentTuple *)action;
  this = (ActionResultHolder<solitaire::graphics::TextureId> *)operator_new(0x10);
  args_00 = args_local;
  std::
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  tuple(&local_28,
        (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         *)local_20._8_8_);
  Action<solitaire::graphics::TextureId_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Perform((Action<solitaire::graphics::TextureId_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)local_20,args_00);
  ReferenceOrValueWrapper<solitaire::graphics::TextureId>::ReferenceOrValueWrapper
            ((ReferenceOrValueWrapper<solitaire::graphics::TextureId> *)(local_20 + 4),
             (TextureId *)local_20);
  ActionResultHolder(this,(Wrapper *)(local_20 + 4));
  return this;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }